

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void google::protobuf::internal::VerifyVersion(int protobufVersionCompiledWith,char *filename)

{
  LogMessage *pLVar1;
  int version;
  int version_00;
  string local_80;
  string local_60;
  LogMessage local_30;
  Voidify local_19;
  char *local_18;
  char *filename_local;
  int protobufVersionCompiledWith_local;
  
  if (protobufVersionCompiledWith != 0x5c0698) {
    local_18 = filename;
    filename_local._4_4_ = protobufVersionCompiledWith;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common.cc"
               ,0x30);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [53])"This program was compiled with Protobuf C++ version "
                       );
    VersionString_abi_cxx11_(&local_60,(internal *)(ulong)filename_local._4_4_,version);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_60);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [29])", but the linked version is ");
    VersionString_abi_cxx11_(&local_80,(internal *)0x5c0698,version_00);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_80);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [205])
                               ".  Please update your library.  If you compiled the program yourself, make sure thatyour headers are from the same version of Protocol Buffers as your link-time library.  (Version verification failed in \""
                       );
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar1,&local_18);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [4])0x74507f)
    ;
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar1);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  return;
}

Assistant:

void VerifyVersion(int protobufVersionCompiledWith, const char* filename) {
  // If the user's program is linked against a different version of Protobuf,
  // GOOGLE_PROTOBUF_VERSION will have a different value.
  if (GOOGLE_PROTOBUF_VERSION != protobufVersionCompiledWith) {
    ABSL_LOG(FATAL)
        << "This program was compiled with Protobuf C++ version "
        << VersionString(protobufVersionCompiledWith)
        << ", but the linked version is "
        << VersionString(GOOGLE_PROTOBUF_VERSION)
        << ".  Please update your library.  If you compiled the program "
           "yourself, make sure that"
           "your headers are from the same version of Protocol Buffers as your "
           "link-time library.  (Version verification failed in \""
        << filename << "\".)";
  }
}